

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Complex * __thiscall Matrix<Complex>::trace(Complex *__return_storage_ptr__,Matrix<Complex> *this)

{
  uint uVar1;
  matrix_error *this_00;
  uint uVar2;
  ulong uVar3;
  
  if (this->N == this->M) {
    Complex::Complex(__return_storage_ptr__);
    if (this->N * this->N != 0) {
      uVar3 = 0;
      do {
        Complex::operator+=(__return_storage_ptr__,this->arr + uVar3);
        uVar1 = this->N;
        uVar2 = (int)uVar3 + uVar1 + 1;
        uVar3 = (ulong)uVar2;
      } while (uVar2 < uVar1 * uVar1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Trying to calculate trace of a non-square matrix");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Field Matrix<Field>::trace() const
{
    if(N != M)
        throw matrix_error("Trying to calculate trace of a non-square matrix");
    Field ans;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans += arr[i];
    }
    return ans;
}